

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogAppInterfaceStd.h
# Opt level: O2

TaskId nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::registerCurrentTask
                 (char *aTaskName)

{
  __node_base __it;
  TaskId TVar1;
  long *in_FS_OFFSET;
  
  std::mutex::lock(&sRegistrationMutex);
  __it = sFreeTaskIds._M_h._M_before_begin;
  if (sFreeTaskIds._M_h._M_element_count == 0) {
    TVar1 = 0xff;
  }
  else {
    TVar1 = *(TaskId *)&sFreeTaskIds._M_h._M_before_begin._M_nxt[1]._M_nxt;
    *(TaskId *)(in_FS_OFFSET + -6) = TVar1;
    AppInterfaceStd<(unsigned_char)2,false,100ul>::shTaskName[abi:cxx11]::__tls_init();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*in_FS_OFFSET + -0x28),aTaskName);
    std::
    _Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::erase(&sFreeTaskIds._M_h,(const_iterator)__it._M_nxt);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&sRegistrationMutex);
  return TVar1;
}

Assistant:

static TaskId registerCurrentTask(char const * const aTaskName) {
    std::lock_guard<std::mutex> lock (sRegistrationMutex);
    TaskId result;
    if(!sFreeTaskIds.empty()) {
      auto begin = sFreeTaskIds.begin();
      shTaskId = result = *begin;
      shTaskName = aTaskName;
      sFreeTaskIds.erase(begin);
    }
    else {
      result = csInvalidTaskId;
    }
    return result;
  }